

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_array_close(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  char *__s;
  uint uVar3;
  size_t sVar4;
  yajl_gen_state yVar5;
  uint _i;
  
  if (g->state[g->depth] == yajl_gen_error) {
    return yajl_gen_in_error_state;
  }
  if (g->state[g->depth] == yajl_gen_complete) {
    return yajl_gen_generation_complete;
  }
  uVar3 = g->depth - 1;
  g->depth = uVar3;
  if (0x7f < uVar3) {
    return yajl_gen_generation_complete;
  }
  if ((g->flags & 1) != 0) {
    (*g->print)(g->ctx,"\n",1);
    uVar3 = g->depth;
  }
  yVar5 = g->state[uVar3];
  switch(yVar5) {
  case yajl_gen_start:
    yVar5 = yajl_gen_complete;
    break;
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    g->state[uVar3] = yajl_gen_map_val;
    goto LAB_00106047;
  case yajl_gen_map_val:
    yVar5 = yajl_gen_map_key;
    break;
  case yajl_gen_array_start:
    yVar5 = yajl_gen_in_array;
    break;
  default:
    goto switchD_00105fe8_default;
  }
  g->state[uVar3] = yVar5;
switchD_00105fe8_default:
  if ((((g->flags & 1) != 0) && (yVar5 != yajl_gen_map_val)) && (uVar3 != 0)) {
    uVar3 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      __s = g->indentString;
      sVar4 = strlen(__s);
      (*p_Var1)(pvVar2,__s,sVar4 & 0xffffffff);
      uVar3 = uVar3 + 1;
    } while (uVar3 < g->depth);
  }
LAB_00106047:
  (*g->print)(g->ctx,"]",1);
  if (((g->flags & 1) != 0) && (g->state[g->depth] == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_array_close(yajl_gen g)
{
    ENSURE_VALID_STATE;
    DECREMENT_DEPTH;
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    APPENDED_ATOM;
    INSERT_WHITESPACE;
    g->print(g->ctx, "]", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}